

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manipulation.h
# Opt level: O0

Nop * wasm::ExpressionManipulator::convert<wasm::Drop,wasm::Nop>(Drop *input)

{
  Nop *output;
  Drop *input_local;
  
  Nop::Nop((Nop *)input);
  return (Nop *)input;
}

Assistant:

inline OutputType* convert(InputType* input) {
  static_assert(sizeof(OutputType) <= sizeof(InputType),
                "Can only convert to a smaller size Expression node");
  input->~InputType(); // arena-allocaed, so no destructor, but avoid UB.
  OutputType* output = (OutputType*)(input);
  new (output) OutputType;
  return output;
}